

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

int lyv_data_context(lyd_node *node,int options,unres_data *unres)

{
  byte bVar1;
  byte bVar2;
  ly_ctx *ctx;
  int iVar3;
  lys_node *plVar4;
  lys_module *plVar5;
  lys_node *plVar6;
  UNRES_ITEM type;
  
  if (unres == (unres_data *)0x0) {
    __assert_fail("unres",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x3c,"int lyv_data_context(const struct lyd_node *, int, struct unres_data *)");
  }
  ctx = node->schema->module->ctx;
  plVar4 = lys_is_disabled(node->schema,2);
  if (plVar4 != (lys_node *)0x0) {
    plVar4 = node->schema;
    goto LAB_0011f354;
  }
  plVar4 = node->schema;
  if ((options & 0x8eU) == 0) {
    if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_0011f420;
    iVar3 = *(int *)&plVar4[1].ref;
    if (iVar3 == 8) {
      type = UNRES_INSTID;
LAB_0011f40d:
      iVar3 = unres_data_add(unres,node,type);
      if (iVar3 != 0) {
        return 1;
      }
    }
    else if (iVar3 == 9) {
      bVar1 = node->validity;
      bVar2 = *(byte *)((long)&node[1].schema + 4);
      if ((bVar2 & 1) != 0 || (bVar1 & 8) != 0) {
        *(byte *)((long)&node[1].schema + 4) = bVar2 & 0xfe;
        node->validity = bVar1 | 8;
        type = UNRES_LEAFREF;
        goto LAB_0011f40d;
      }
    }
    else if ((iVar3 == 0xb) && (*(int *)&plVar4[1].field_0x3c != 0)) {
      type = UNRES_UNION;
      goto LAB_0011f40d;
    }
LAB_0011f420:
    if (((node->field_0x9 & 8) != 0) && (iVar3 = unres_data_add(unres,node,UNRES_WHEN), iVar3 != 0))
    {
      return 1;
    }
  }
  else if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    node->validity = node->validity & 0xf7;
  }
  if (((options & 0xdU) == 0) || (plVar4 = node->schema, (plVar4->flags & 2) == 0)) {
    if ((options & 0x2080U) != 0) {
      return 0;
    }
    if ((node->validity & 4) == 0) {
      return 0;
    }
    iVar3 = lyp_is_rpc_action(node->schema);
    if (iVar3 == 0) {
      return 0;
    }
    if (node->prev == node) {
      return 0;
    }
    if (node->prev->next == (lyd_node *)0x0) {
      return 0;
    }
    for (plVar4 = lys_parent(node->schema); plVar4 != (lys_node *)0x0; plVar4 = lys_parent(plVar4))
    {
      if ((plVar4->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) goto LAB_0011f4cb;
    }
    plVar4 = (lys_node *)0x0;
LAB_0011f4cb:
    plVar6 = node->schema;
    plVar5 = lyd_node_module(node);
    plVar6 = lys_getnext(plVar6,plVar4,plVar5,0);
    while( true ) {
      if (plVar6 == (lys_node *)0x0) {
        return 0;
      }
      if (plVar6 == node->prev->schema) break;
      plVar5 = lyd_node_module(node);
      plVar6 = lys_getnext(plVar6,plVar4,plVar5,0);
    }
    ly_vlog(ctx,LYE_INORDER,LY_VLOG_LYD,node,node->schema->name,plVar6->name);
    return 1;
  }
LAB_0011f354:
  ly_vlog(ctx,LYE_INELEM,LY_VLOG_LYD,node,plVar4->name);
  return 1;
}

Assistant:

int
lyv_data_context(const struct lyd_node *node, int options, struct unres_data *unres)
{
    const struct lys_node *siter = NULL;
    struct lys_node *sparent;
    struct lyd_node_leaf_list *leaf = (struct lyd_node_leaf_list *)node;
    struct ly_ctx *ctx = node->schema->module->ctx;

    assert(node);
    assert(unres);

    /* check if the node instance is enabled by if-feature */
    if (lys_is_disabled(node->schema, 2)) {
        LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, node, node->schema->name);
        return 1;
    }

    if (!(options & (LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
        if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            /* if union with leafref/intsid, leafref itself (invalid) or instance-identifier, store the node for later resolving */
            if ((((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_UNION)
                    && ((struct lys_node_leaf *)leaf->schema)->type.info.uni.has_ptr_type) {
                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_UNION)) {
                    return 1;
                }
            } else if ((((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_LEAFREF)
                    && ((leaf->validity & LYD_VAL_LEAFREF) || (leaf->value_flags & LY_VALUE_UNRES))) {
                /* always retry validation on unres leafrefs, if again not possible, the correct flags should
                 * be set and the leafref will be kept unresolved */
                leaf->value_flags &= ~LY_VALUE_UNRES;
                leaf->validity |= LYD_VAL_LEAFREF;

                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_LEAFREF)) {
                    return 1;
                }
            } else if (((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_INST) {
                if (unres_data_add(unres, (struct lyd_node *)node, UNRES_INSTID)) {
                    return 1;
                }
            }
        }

        /* check all relevant when conditions */
        if (node->when_status & LYD_WHEN) {
            if (unres_data_add(unres, (struct lyd_node *)node, UNRES_WHEN)) {
                return 1;
            }
        }
    } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* just remove the flag if it was set */
        leaf->validity &= ~LYD_VAL_LEAFREF;
    }

    /* check for (non-)presence of status data in edit-config data */
    if ((options & (LYD_OPT_EDIT | LYD_OPT_GETCONFIG | LYD_OPT_CONFIG)) && (node->schema->flags & LYS_CONFIG_R)) {
        LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, node, node->schema->name);
        return 1;
    }

    /* check elements order in case of RPC's input and output */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER)) && (node->validity & LYD_VAL_MAND) && lyp_is_rpc_action(node->schema)) {
        if ((node->prev != node) && node->prev->next) {
            /* find schema data parent */
            for (sparent = lys_parent(node->schema);
                    sparent && (sparent->nodetype & (LYS_USES | LYS_CHOICE | LYS_CASE));
                    sparent = lys_parent(sparent));
            for (siter = lys_getnext(node->schema, sparent, lyd_node_module(node), 0);
                    siter;
                    siter = lys_getnext(siter, sparent, lyd_node_module(node), 0)) {
                if (siter == node->prev->schema) {
                    /* data predecessor has the schema node after
                     * the schema node of the data node being checked */
                    LOGVAL(ctx, LYE_INORDER, LY_VLOG_LYD, node, node->schema->name, siter->name);
                    return 1;
                }
            }

        }
    }

    return 0;
}